

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderErrorCode duckdb_brotli::SkipMetadataBlock(BrotliDecoderStateInternal *s)

{
  long in_RDI;
  int nbytes;
  int nbytes_1;
  uint8_t buffer [8];
  BrotliBitReader *br;
  size_t avail_in;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [8];
  ulong *local_b0;
  long local_a8;
  BrotliDecoderErrorCode local_9c;
  ulong *local_98;
  ulong *local_90;
  ulong local_88;
  ulong *local_80;
  long local_78;
  ulong *local_70;
  ulong *local_68;
  size_t local_60;
  ulong *local_58;
  undefined1 *local_50;
  ulong *local_48;
  ulong *local_40;
  ulong *local_38;
  undefined8 local_30;
  ulong *local_28;
  size_t local_20;
  ulong *local_18;
  
  local_b0 = (ulong *)(in_RDI + 8);
  if (*(int *)(in_RDI + 0x84) == 0) {
    local_9c = BROTLI_DECODER_SUCCESS;
  }
  else {
    local_a8 = in_RDI;
    local_90 = local_b0;
    if (7 < *(ulong *)(in_RDI + 0x10)) {
      local_bc = (int)*(undefined8 *)(in_RDI + 0x10) >> 3;
      if (*(int *)(in_RDI + 0x84) < local_bc) {
        local_bc = *(int *)(in_RDI + 0x84);
      }
      local_50 = local_b8;
      local_98 = local_b0;
      local_58 = local_b0;
      for (local_60 = (size_t)local_bc; local_48 = local_58, 7 < local_58[1] && local_60 != 0;
          local_60 = local_60 - 1) {
        local_38 = local_58;
        *local_50 = (char)*local_58;
        local_28 = local_58;
        local_30 = 8;
        local_58[1] = local_58[1] - 8;
        *local_58 = *local_58 >> 8;
        local_50 = local_50 + 1;
      }
      local_40 = local_58;
      if (local_58[1] < 0x40) {
        *local_58 = (1L << ((byte)local_58[1] & 0x3f)) - 1U & *local_58;
      }
      if (local_60 != 0) {
        memcpy(local_50,(void *)local_58[2],local_60);
        local_18 = local_58;
        local_20 = local_60;
        local_58[2] = local_60 + local_58[2];
      }
      if (*(long *)(local_a8 + 0x2d8) != 0) {
        (**(code **)(local_a8 + 0x2d8))(*(undefined8 *)(local_a8 + 0x2e0),local_b8,(long)local_bc);
      }
      *(int *)(local_a8 + 0x84) = *(int *)(local_a8 + 0x84) - local_bc;
      if (*(int *)(local_a8 + 0x84) == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    local_80 = local_b0;
    local_70 = local_b0;
    local_88 = local_b0[4] - local_b0[2];
    if (local_88 < 0x40000001) {
      local_68 = local_b0;
      local_78 = local_88 + (local_b0[1] >> 3);
    }
    else {
      local_78 = 0x40000000;
    }
    local_c0 = (int)local_78;
    if (*(int *)(local_a8 + 0x84) < local_c0) {
      local_c0 = *(int *)(local_a8 + 0x84);
    }
    if (0 < local_c0) {
      if (*(long *)(local_a8 + 0x2d8) != 0) {
        (**(code **)(local_a8 + 0x2d8))
                  (*(undefined8 *)(local_a8 + 0x2e0),local_b0[2],(long)local_c0);
      }
      local_b0[2] = (long)local_c0 + local_b0[2];
      *(int *)(local_a8 + 0x84) = *(int *)(local_a8 + 0x84) - local_c0;
      if (*(int *)(local_a8 + 0x84) == 0) {
        return BROTLI_DECODER_SUCCESS;
      }
    }
    local_9c = BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  return local_9c;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE SkipMetadataBlock(BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;

	if (s->meta_block_remaining_len == 0) {
		return BROTLI_DECODER_SUCCESS;
	}

	BROTLI_DCHECK((BrotliGetAvailableBits(br) & 7) == 0);

	/* Drain accumulator. */
	if (BrotliGetAvailableBits(br) >= 8) {
		uint8_t buffer[8];
		int nbytes = (int)(BrotliGetAvailableBits(br)) >> 3;
		BROTLI_DCHECK(nbytes <= 8);
		if (nbytes > s->meta_block_remaining_len) {
			nbytes = s->meta_block_remaining_len;
		}
		BrotliCopyBytes(buffer, br, (size_t)nbytes);
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, buffer, (size_t)nbytes);
		}
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	/* Direct access to metadata is possible. */
	int nbytes = (int)BrotliGetRemainingBytes(br);
	if (nbytes > s->meta_block_remaining_len) {
		nbytes = s->meta_block_remaining_len;
	}
	if (nbytes > 0) {
		if (s->metadata_chunk_func) {
			s->metadata_chunk_func(s->metadata_callback_opaque, br->next_in, (size_t)nbytes);
		}
		BrotliDropBytes(br, (size_t)nbytes);
		s->meta_block_remaining_len -= nbytes;
		if (s->meta_block_remaining_len == 0) {
			return BROTLI_DECODER_SUCCESS;
		}
	}

	BROTLI_DCHECK(BrotliGetRemainingBytes(br) == 0);

	return BROTLI_DECODER_NEEDS_MORE_INPUT;
}